

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O2

void ctemplate_htmlparser::statemachine_reset(statemachine_ctx *ctx)

{
  ctx->current_state = 0;
  ctx->next_state = 0;
  ctx->record_buffer[0] = '\0';
  ctx->record_pos = 0;
  ctx->recording = 0;
  ctx->line_number = 1;
  ctx->column_number = 1;
  return;
}

Assistant:

void statemachine_reset(statemachine_ctx *ctx)
{
  ctx->current_state = 0;
  ctx->next_state = 0;
  ctx->record_buffer[0] = '\0';
  ctx->record_pos = 0;
  ctx->recording = 0;
  ctx->line_number = 1;
  ctx->column_number = 1;
}